

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeCalcSplitRects
               (ImVec2 *pos_old,ImVec2 *size_old,ImVec2 *pos_new,ImVec2 *size_new,ImGuiDir dir,
               ImVec2 size_new_desired)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  float *pfVar4;
  float fVar5;
  bool local_4d;
  float w_avail;
  ImGuiAxis axis;
  float dock_spacing;
  ImGuiContext *g;
  ImGuiDir dir_local;
  ImVec2 *size_new_local;
  ImVec2 *pos_new_local;
  ImVec2 *size_old_local;
  ImVec2 *pos_old_local;
  ImVec2 size_new_desired_local;
  
  fVar1 = (GImGui->Style).ItemInnerSpacing.x;
  local_4d = 1 < (uint)dir;
  uVar3 = (uint)local_4d;
  pos_old_local = (ImVec2 *)size_new_desired;
  pfVar4 = ImVec2::operator[](pos_old,(long)(int)(uVar3 ^ 1));
  fVar5 = *pfVar4;
  pfVar4 = ImVec2::operator[](pos_new,(long)(int)(uVar3 ^ 1));
  *pfVar4 = fVar5;
  pfVar4 = ImVec2::operator[](size_old,(long)(int)(uVar3 ^ 1));
  fVar5 = *pfVar4;
  pfVar4 = ImVec2::operator[](size_new,(long)(int)(uVar3 ^ 1));
  *pfVar4 = fVar5;
  pfVar4 = ImVec2::operator[](size_old,(long)(int)uVar3);
  fVar5 = *pfVar4 - fVar1;
  pfVar4 = ImVec2::operator[]((ImVec2 *)&pos_old_local,(long)(int)uVar3);
  if ((*pfVar4 <= 0.0) ||
     (pfVar4 = ImVec2::operator[]((ImVec2 *)&pos_old_local,(long)(int)uVar3), fVar5 * 0.5 < *pfVar4)
     ) {
    pfVar4 = ImVec2::operator[](size_new,(long)(int)uVar3);
    *pfVar4 = (float)(int)(fVar5 * 0.5);
    pfVar4 = ImVec2::operator[](size_new,(long)(int)uVar3);
    fVar2 = *pfVar4;
    pfVar4 = ImVec2::operator[](size_old,(long)(int)uVar3);
    *pfVar4 = (float)(int)(fVar5 - fVar2);
  }
  else {
    pfVar4 = ImVec2::operator[]((ImVec2 *)&pos_old_local,(long)(int)uVar3);
    fVar2 = *pfVar4;
    pfVar4 = ImVec2::operator[](size_new,(long)(int)uVar3);
    *pfVar4 = fVar2;
    pfVar4 = ImVec2::operator[](size_new,(long)(int)uVar3);
    fVar2 = *pfVar4;
    pfVar4 = ImVec2::operator[](size_old,(long)(int)uVar3);
    *pfVar4 = (float)(int)(fVar5 - fVar2);
  }
  if ((dir == 1) || (dir == 3)) {
    pfVar4 = ImVec2::operator[](pos_old,(long)(int)uVar3);
    fVar5 = *pfVar4;
    pfVar4 = ImVec2::operator[](size_old,(long)(int)uVar3);
    fVar2 = *pfVar4;
    pfVar4 = ImVec2::operator[](pos_new,(long)(int)uVar3);
    *pfVar4 = fVar5 + fVar2 + fVar1;
  }
  else if ((dir == 0) || (dir == 2)) {
    pfVar4 = ImVec2::operator[](pos_old,(long)(int)uVar3);
    fVar5 = *pfVar4;
    pfVar4 = ImVec2::operator[](pos_new,(long)(int)uVar3);
    *pfVar4 = fVar5;
    pfVar4 = ImVec2::operator[](pos_new,(long)(int)uVar3);
    fVar5 = *pfVar4;
    pfVar4 = ImVec2::operator[](size_new,(long)(int)uVar3);
    fVar2 = *pfVar4;
    pfVar4 = ImVec2::operator[](pos_old,(long)(int)uVar3);
    *pfVar4 = fVar5 + fVar2 + fVar1;
  }
  return;
}

Assistant:

void ImGui::DockNodeCalcSplitRects(ImVec2& pos_old, ImVec2& size_old, ImVec2& pos_new, ImVec2& size_new, ImGuiDir dir, ImVec2 size_new_desired)
{
    ImGuiContext& g = *GImGui;
    const float dock_spacing = g.Style.ItemInnerSpacing.x;
    const ImGuiAxis axis = (dir == ImGuiDir_Left || dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
    pos_new[axis ^ 1] = pos_old[axis ^ 1];
    size_new[axis ^ 1] = size_old[axis ^ 1];

    // Distribute size on given axis (with a desired size or equally)
    const float w_avail = size_old[axis] - dock_spacing;
    if (size_new_desired[axis] > 0.0f && size_new_desired[axis] <= w_avail * 0.5f)
    {
        size_new[axis] = size_new_desired[axis];
        size_old[axis] = IM_FLOOR(w_avail - size_new[axis]);
    }
    else
    {
        size_new[axis] = IM_FLOOR(w_avail * 0.5f);
        size_old[axis] = IM_FLOOR(w_avail - size_new[axis]);
    }

    // Position each node
    if (dir == ImGuiDir_Right || dir == ImGuiDir_Down)
    {
        pos_new[axis] = pos_old[axis] + size_old[axis] + dock_spacing;
    }
    else if (dir == ImGuiDir_Left || dir == ImGuiDir_Up)
    {
        pos_new[axis] = pos_old[axis];
        pos_old[axis] = pos_new[axis] + size_new[axis] + dock_spacing;
    }
}